

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[81],_char[4608],_char_*,_const_char_*,_short,_int,_const_char_*,_const_char_*,_char_*,_const_char_*,_short>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,char_const(&)[81],char_const(&)[4608],char*const&,char_const*const&,short_const&,int_const&,char_const*const&,char_const*const&,char*const&,char_const*const&,short_const&>
          (format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[81],_char[4608],_char_*,_const_char_*,_short,_int,_const_char_*,_const_char_*,_char_*,_const_char_*,_short>
           *__return_storage_ptr__,v9 *this,char (*args) [81],char (*args_1) [4608],char **args_2,
          char **args_3,short *args_4,int *args_5,char **args_6,char **args_7,char **args_8,
          char **args_9,short *args_10)

{
  longlong lVar1;
  char *pcVar2;
  longlong lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  bool formattable_8;
  bool formattable_pointer_8;
  bool formattable_const_8;
  bool formattable_char_8;
  char_type **arg_8;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_const_4;
  bool formattable_char_4;
  int *arg_4;
  bool formattable_10;
  bool formattable_pointer_10;
  bool formattable_const_10;
  bool formattable_char_10;
  int *arg_10;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  char_type **arg_3;
  bool formattable_6;
  bool formattable_pointer_6;
  bool formattable_const_6;
  bool formattable_char_6;
  char_type **arg_6;
  bool formattable_7;
  bool formattable_pointer_7;
  bool formattable_const_7;
  bool formattable_char_7;
  char_type **arg_7;
  bool formattable_9;
  bool formattable_pointer_9;
  bool formattable_const_9;
  bool formattable_char_9;
  char_type **arg_9;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  bool formattable_5;
  bool formattable_pointer_5;
  bool formattable_const_5;
  bool formattable_char_5;
  int *arg_5;
  size_t local_4a0;
  size_t local_470;
  longlong local_408;
  size_t local_400;
  longlong local_3c8;
  size_t local_3c0;
  size_t local_360;
  size_t local_320;
  size_t local_2e0;
  size_t local_2a0;
  size_t local_f0;
  size_t local_a0;
  short *args_local_4;
  char **args_local_3;
  char **args_local_2;
  char (*args_local_1) [4608];
  char (*args_local) [81];
  size_t local_50;
  
  lVar1 = *(longlong *)*args_1;
  pcVar2 = *args_2;
  local_408._0_4_ = (int)*(short *)args_3;
  args_local._0_4_ = *(undefined4 *)args_4;
  lVar3 = *(longlong *)args_5;
  pcVar4 = *args_6;
  pcVar5 = *args_7;
  pcVar6 = *args_8;
  local_3c8._0_4_ = (int)*(short *)args_9;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_f0;
  (__return_storage_ptr__->data_).args_[1].field_0.pointer = args;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_a0;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_4a0;
  (__return_storage_ptr__->data_).args_[3].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_360;
  (__return_storage_ptr__->data_).args_[4].field_0.long_long_value = local_408;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_400;
  (__return_storage_ptr__->data_).args_[5].field_0.pointer = args_local;
  (__return_storage_ptr__->data_).args_[5].field_0.string.size = local_50;
  (__return_storage_ptr__->data_).args_[6].field_0.long_long_value = lVar3;
  (__return_storage_ptr__->data_).args_[6].field_0.string.size = local_320;
  (__return_storage_ptr__->data_).args_[7].field_0.string.data = pcVar4;
  (__return_storage_ptr__->data_).args_[7].field_0.string.size = local_2e0;
  (__return_storage_ptr__->data_).args_[8].field_0.string.data = pcVar5;
  (__return_storage_ptr__->data_).args_[8].field_0.string.size = local_470;
  (__return_storage_ptr__->data_).args_[9].field_0.string.data = pcVar6;
  (__return_storage_ptr__->data_).args_[9].field_0.string.size = local_2a0;
  (__return_storage_ptr__->data_).args_[10].field_0.long_long_value = local_3c8;
  (__return_storage_ptr__->data_).args_[10].field_0.string.size = local_3c0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}